

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputreader.cpp
# Opt level: O0

void __thiscall InputReader::readFile(InputReader *this,char *inpFile,Network *network)

{
  byte bVar1;
  FileError *this_00;
  undefined1 local_438 [8];
  PropertyParser propertyParser;
  ObjectParser objectParser;
  istream local_228 [8];
  ifstream fin;
  Network *network_local;
  char *inpFile_local;
  InputReader *this_local;
  
  this->section = -1;
  std::ifstream::ifstream(local_228,inpFile,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (FileError *)__cxa_allocate_exception(0x30);
    FileError::FileError(this_00,1);
    __cxa_throw(this_00,&FileError::typeinfo,FileError::~FileError);
  }
  ObjectParser::ObjectParser
            ((ObjectParser *)
             &propertyParser.tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,network);
  parseFile(this,local_228,
            (InputParser *)
            &propertyParser.tokens.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  PropertyParser::PropertyParser((PropertyParser *)local_438,network);
  parseFile(this,local_228,(InputParser *)local_438);
  std::ifstream::close();
  PropertyParser::~PropertyParser((PropertyParser *)local_438);
  ObjectParser::~ObjectParser
            ((ObjectParser *)
             &propertyParser.tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void InputReader::readFile(const char* inpFile, Network* network)
{
    // ... initialize current input section

    section = -1;

    // ... open the input file

    ifstream fin(inpFile, ios::in);
    if (!fin.is_open()) throw FileError(FileError::CANNOT_OPEN_INPUT_FILE);
    try
    {
        // ... parse object names from the file

        ObjectParser objectParser(network);
        parseFile(fin, objectParser);

        // ... parse object properties from the file

        PropertyParser propertyParser(network);
        parseFile(fin, propertyParser);
        fin.close();
    }

    // ... catch and re-throw any exception thrown by the parsing process

    catch (...)
    {
        fin.close();
        throw;
    }
}